

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O1

Instr * Peeps::CleanupLabel(LabelInstr *instr,LabelInstr *instrNext)

{
  SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *this;
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  LabelInstr *pLVar4;
  undefined4 *puVar5;
  Type *ppBVar6;
  LabelInstr *newLabelInstr;
  
  if ((instrNext->field_0x78 & 5) == 0) {
    pLVar4 = (LabelInstr *)(instrNext->super_Instr).m_next;
    newLabelInstr = instr;
    instr = instrNext;
  }
  else {
    pLVar4 = instrNext;
    newLabelInstr = instrNext;
    if ((instr->field_0x78 & 5) != 0) {
      return &instrNext->super_Instr;
    }
  }
  this = &instr->labelRefs;
  if ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
      (instr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != this) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      ppBVar6 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                          ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)this);
      bVar3 = IR::BranchInstr::ReplaceTarget(*ppBVar6,instr,newLabelInstr);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x3f7,"(replaced)","replaced");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    } while ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
             (this->super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next != this);
  }
  if ((instr->field_0x78 & 2) != 0) {
    bVar1 = newLabelInstr->field_0x78;
    newLabelInstr->field_0x78 = bVar1 | 2;
    if ((instr->field_0x78 & 0x20) != 0) {
      newLabelInstr->field_0x78 = bVar1 | 0x22;
    }
  }
  IR::Instr::Remove(&instr->super_Instr);
  return &pLVar4->super_Instr;
}

Assistant:

IR::Instr *
Peeps::CleanupLabel(IR::LabelInstr * instr, IR::LabelInstr * instrNext)
{
    IR::Instr * returnInstr;

    IR::LabelInstr * labelToRemove;
    IR::LabelInstr * labelToKeep;

    // Just for dump, always keep loop top labels
    // We also can remove label that has non branch references
    if (instrNext->m_isLoopTop || instrNext->m_hasNonBranchRef)
    {
        if (instr->m_isLoopTop || instr->m_hasNonBranchRef)
        {
            // Don't remove loop top labels or labels with non branch references
            return instrNext;
        }
        labelToRemove = instr;
        labelToKeep = instrNext;
        returnInstr = instrNext;
    }
    else
    {
        labelToRemove = instrNext;
        labelToKeep = instr;
        returnInstr = instrNext->m_next;
    }
    while (!labelToRemove->labelRefs.Empty())
    {
        bool replaced = labelToRemove->labelRefs.Head()->ReplaceTarget(labelToRemove, labelToKeep);
        Assert(replaced);
    }

    if (labelToRemove->isOpHelper)
    {
        labelToKeep->isOpHelper = true;
#if DBG
        if (labelToRemove->m_noHelperAssert)
        {
            labelToKeep->m_noHelperAssert = true;
        }
#endif
    }

    labelToRemove->Remove();
    return returnInstr;
}